

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O0

TPZAutoPointer<TPZMatrix<float>_> __thiscall
TPZSTShiftOrigin<float>::CalcMatrix
          (TPZSTShiftOrigin<float> *this,TPZAutoPointer<TPZMatrix<float>_> *A)

{
  TPZBaseMatrix *this_00;
  TPZMatrix<float> *pTVar1;
  long lVar2;
  TPZMatrix<float> *pTVar3;
  TPZAutoPointer<TPZMatrix<float>_> *in_RDX;
  TPZSTShiftOrigin<float> *in_RSI;
  TPZReference *in_RDI;
  float extraout_XMM0_Da;
  int i;
  float *shift;
  int64_t nRows;
  TPZAutoPointer<TPZMatrix<float>_> *shiftedMat;
  TPZAutoPointer<TPZMatrix<float>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float local_48 [4];
  int local_38;
  float local_34;
  float *local_30;
  undefined1 local_21;
  int64_t local_20;
  
  this_00 = &TPZAutoPointer<TPZMatrix<float>_>::operator->(in_RDX)->super_TPZBaseMatrix;
  local_20 = TPZBaseMatrix::Rows(this_00);
  local_21 = 0;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  local_34 = Shift(in_RSI);
  local_30 = &local_34;
  for (local_38 = 0; local_38 < local_20; local_38 = local_38 + 1) {
    pTVar1 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
    lVar2 = (long)local_38;
    pTVar3 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
    (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pTVar3,(long)local_38);
    local_48[0] = extraout_XMM0_Da - *local_30;
    (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
              (pTVar1,lVar2,lVar2,local_48);
  }
  return (TPZAutoPointer<TPZMatrix<float>_>)in_RDI;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A) const
{
  const auto nRows = A->Rows();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //calculating A-sigmaB
  const auto &shift = Shift();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}